

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O3

U32 __thiscall
MDIOSimulationDataGenerator::GenerateSimulationData
          (MDIOSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  MdioOpCode opCode;
  char cVar1;
  U32 UVar2;
  ulong uVar3;
  ulong uVar4;
  SimulationChannelDescriptor *pSVar5;
  byte bVar6;
  uint uVar7;
  U8 phyAddress;
  uint uVar8;
  U16 regAddress;
  
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (uVar4 < uVar3) {
    uVar8 = (int)this + 0x18;
    phyAddress = '\0';
    uVar7 = 0;
    do {
      cVar1 = (char)((uVar7 & 0xff) * 0x25 >> 8);
      bVar6 = (byte)(((byte)((U8)uVar7 - cVar1) >> 1) + cVar1) >> 2;
      opCode = *(MdioOpCode *)
                (&DAT_00109440 + (ulong)(uVar7 + ((uVar7 & 0xff) / 3) * -3 & 0xff) * 4);
      regAddress = (U16)uVar7;
      CreateMdioC45Transaction
                (this,opCode,phyAddress,
                 *(MdioDevType *)
                  (&DAT_00109450 + (ulong)((uint)bVar6 + (uint)bVar6 * -8 + uVar7 & 0xff) * 4),
                 regAddress,regAddress);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptorGroup::AdvanceAll(uVar8);
      CreateMdioC22Transaction(this,opCode,phyAddress + '\x01',(U8)uVar7,regAddress);
      ClockGenerator::AdvanceByHalfPeriod(20.0);
      SimulationChannelDescriptorGroup::AdvanceAll(uVar8);
      uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
      phyAddress = phyAddress + '\x02';
      uVar7 = uVar7 + 1;
    } while (uVar4 < uVar3);
  }
  pSVar5 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar5;
  UVar2 = SimulationChannelDescriptorGroup::GetCount();
  return UVar2;
}

Assistant:

U32 MDIOSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    MdioOpCode opcodeValues[ 3 ] = { C45_WRITE, C22_READ, C45_READ }; // address
    U8 opIndex = 0;

    MdioDevType devTypeValues[ 7 ] = { DEV_RESERVED, DEV_PMD_PMA, DEV_WIS, DEV_PCS, DEV_PHY_XS, DEV_DTE_XS, DEV_OTHER };
    U8 devTypeIndex = 0;

    U16 regAddrValue = 0;
    U8 regAddrValue5b = 0;

    U16 dataValueC22 = 0;
    U16 dataValueC45 = 0;
    U8 phyAddressValue = 0;

    while( mMdc->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateMdioC45Transaction( opcodeValues[ opIndex % 3 ],         // OpCode
                                  phyAddressValue++,                   // PHY Address
                                  devTypeValues[ devTypeIndex++ % 7 ], // DevType
                                  regAddrValue++,                      // Register Address
                                  dataValueC45++                       // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 5 periods of idle

        CreateMdioC22Transaction( opcodeValues[ opIndex++ % 3 ], // OpCode
                                  phyAddressValue++,             // PHY Address
                                  regAddrValue5b++,              // Register Address
                                  dataValueC22++                 // Data
        );

        mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 10 periods of idle
    }

    *simulation_channels = mSimulationChannels.GetArray();
    return mSimulationChannels.GetCount();
}